

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dae.cpp
# Opt level: O3

Dae * __thiscall opencollada::Dae::operator=(Dae *this,Dae *other)

{
  XmlDoc::operator=(&this->super_XmlDoc,&other->super_XmlDoc);
  ::std::__cxx11::string::operator=((string *)&this->mUri,(string *)&other->mUri);
  ::std::__cxx11::string::operator=
            ((string *)&(this->mUri).mScheme,(string *)&(other->mUri).mScheme);
  ::std::__cxx11::string::operator=
            ((string *)&(this->mUri).mAuthority,(string *)&(other->mUri).mAuthority);
  ::std::__cxx11::string::operator=((string *)&(this->mUri).mPath,(string *)&(other->mUri).mPath);
  ::std::__cxx11::string::operator=((string *)&(this->mUri).mQuery,(string *)&(other->mUri).mQuery);
  ::std::__cxx11::string::operator=
            ((string *)&(this->mUri).mFragment,(string *)&(other->mUri).mFragment);
  (this->mUri).mValid = (other->mUri).mValid;
  ::std::
  map<opencollada::Uri,_opencollada::Dae,_std::less<opencollada::Uri>,_std::allocator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>_>
  ::operator=(&this->mExternalDAEs,&other->mExternalDAEs);
  return this;
}

Assistant:

const Dae & Dae::operator = (Dae && other)
	{
		this->XmlDoc::operator=(std::move(other));
		mUri = std::move(other.mUri);
		mExternalDAEs = std::move(other.mExternalDAEs);
		return *this;
	}